

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

bool __thiscall absl::Mutex::ReaderTryLock(Mutex *this)

{
  ulong uVar1;
  int local_6c;
  ulong uStack_68;
  int loop_limit;
  intptr_t v;
  Mutex *this_local;
  ulong local_50;
  memory_order local_48;
  int local_44;
  memory_order __b;
  undefined1 local_31;
  long local_30;
  undefined4 local_28;
  undefined4 local_24;
  long local_20;
  undefined1 *local_18;
  Mutex *local_10;
  
  local_44 = 0;
  v = (intptr_t)this;
  ___b = this;
  local_48 = std::operator&(memory_order_relaxed,__memory_order_mask);
  if (local_44 - 1U < 2) {
    local_50 = (this->mu_).super___atomic_base<long>._M_i;
  }
  else if (local_44 == 5) {
    local_50 = (this->mu_).super___atomic_base<long>._M_i;
  }
  else {
    local_50 = (this->mu_).super___atomic_base<long>._M_i;
  }
  uStack_68 = local_50;
  local_6c = 5;
  while( true ) {
    if ((local_6c == 0) || ((uStack_68 & 0x1c) != 0)) {
      if ((uStack_68 & 0x10) == 0) {
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = ReaderTryLockSlow(this);
      }
      return this_local._7_1_;
    }
    local_30 = (uStack_68 | 1) + 0x100;
    local_18 = (undefined1 *)&stack0xffffffffffffff98;
    local_24 = 2;
    local_28 = 0;
    LOCK();
    uVar1 = (this->mu_).super___atomic_base<long>._M_i;
    local_31 = uStack_68 == uVar1;
    if ((bool)local_31) {
      (this->mu_).super___atomic_base<long>._M_i = local_30;
      uVar1 = uStack_68;
    }
    UNLOCK();
    local_20 = local_30;
    local_10 = this;
    if ((bool)local_31) break;
    local_6c = local_6c + -1;
    uStack_68 = uVar1;
  }
  DebugOnlyLockEnter(this);
  return true;
}

Assistant:

bool Mutex::ReaderTryLock() {
  ABSL_TSAN_MUTEX_PRE_LOCK(this,
                           __tsan_mutex_read_lock | __tsan_mutex_try_lock);
  intptr_t v = mu_.load(std::memory_order_relaxed);
  // Clang tends to unroll the loop when compiling with optimization.
  // But in this case it just unnecessary increases code size.
  // If CAS is failing due to contention, the jump cost is negligible.
#if defined(__clang__)
#pragma nounroll
#endif
  // The while-loops (here and below) iterate only if the mutex word keeps
  // changing (typically because the reader count changes) under the CAS.
  // We limit the number of attempts to avoid having to think about livelock.
  for (int loop_limit = 5; loop_limit != 0; loop_limit--) {
    if (ABSL_PREDICT_FALSE((v & (kMuWriter | kMuWait | kMuEvent)) != 0)) {
      break;
    }
    if (ABSL_PREDICT_TRUE(mu_.compare_exchange_strong(
            v, (kMuReader | v) + kMuOne, std::memory_order_acquire,
            std::memory_order_relaxed))) {
      DebugOnlyLockEnter(this);
      ABSL_TSAN_MUTEX_POST_LOCK(
          this, __tsan_mutex_read_lock | __tsan_mutex_try_lock, 0);
      return true;
    }
  }
  if (ABSL_PREDICT_TRUE((v & kMuEvent) == 0)) {
    ABSL_TSAN_MUTEX_POST_LOCK(this,
                              __tsan_mutex_read_lock | __tsan_mutex_try_lock |
                                  __tsan_mutex_try_lock_failed,
                              0);
    return false;
  }
  // we're recording events
  return ReaderTryLockSlow();
}